

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
HdlcSimulationDataGenerator::Crc8
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  value_type local_62 [2];
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> divisor;
  value_type local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *stream_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *crc8Ret;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)stream;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,stream);
  local_31 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  local_62[1] = 0x83;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,local_62 + 1);
  local_62[0] = 0x80;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,local_62);
  CrcDivision(__return_storage_ptr__,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::Crc8( const vector<U8>& stream )
{
    vector<U8> result = stream;
    result.push_back( 0x00 );

    // ISO/IEC 13239:2002(E) page 14
    // CRC8 Divisor (9 bits) - x**8 + x**2 + x + 1
    vector<U8> divisor;
    divisor.push_back( 0x83 );
    divisor.push_back( 0x80 );

    vector<U8> crc8Ret = CrcDivision( result, divisor, 8 );
    return crc8Ret;
}